

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_color_to_buffer(int width,int height,rf_color color,rf_color *dst,rf_int dst_size)

{
  rf_image *in_RDI;
  long lVar1;
  
  if (0 < dst_size) {
    lVar1 = 0;
    do {
      dst[lVar1] = color;
      lVar1 = lVar1 + 1;
    } while (dst_size != lVar1);
  }
  in_RDI->data = dst;
  in_RDI->width = width;
  in_RDI->height = height;
  in_RDI->format = RF_UNCOMPRESSED_R8G8B8A8;
  in_RDI->valid = true;
  return in_RDI;
}

Assistant:

RF_API rf_image rf_gen_image_color_to_buffer(int width, int height, rf_color color, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    for (rf_int i = 0; i < dst_size; i++)
    {
        dst[i] = color;
    }

    return (rf_image) {
        .data   = dst,
        .width  = width,
        .height = height,
        .format = RF_UNCOMPRESSED_R8G8B8A8,
        .valid  = true,
    };
}